

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ArrayDeathTest_BoundsChecks_Test::~ArrayDeathTest_BoundsChecks_Test
          (ArrayDeathTest_BoundsChecks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArrayDeathTest, BoundsChecks) {
  Array<int> array;
  EXPECT_DEATH_IF_SUPPORTED(array.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(array.back(), "");
  const int v[] = {1, 2, 3, 4};
  ASSERT_TRUE(array.CopyFrom(v));
  EXPECT_DEATH_IF_SUPPORTED(array[4], "");
}